

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzio.c
# Opt level: O2

int destroy(gz_stream *s)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  
  free(s->msg);
  iVar1 = 0;
  if ((s->stream).state != (internal_state *)0x0) {
    if (s->mode == 'r') {
      iVar1 = cm_zlib_inflateEnd(&s->stream);
    }
    else if (s->mode == 'w') {
      iVar1 = cm_zlib_deflateEnd((z_streamp_conflict)s);
    }
  }
  if ((((FILE *)s->file != (FILE *)0x0) && (iVar2 = fclose((FILE *)s->file), iVar2 != 0)) &&
     (piVar3 = __errno_location(), *piVar3 != 0x1d)) {
    iVar1 = -1;
  }
  if (s->z_err < 0) {
    iVar1 = s->z_err;
  }
  free(s->inbuf);
  free(s->outbuf);
  free(s->path);
  free(s);
  return iVar1;
}

Assistant:

local int destroy (s)
    gz_stream *s;
{
    int err = Z_OK;

    if (!s) return Z_STREAM_ERROR;

    TRYFREE(s->msg);

    if (s->stream.state != NULL) {
        if (s->mode == 'w') {
#ifdef NO_GZCOMPRESS
            err = Z_STREAM_ERROR;
#else
            err = deflateEnd(&(s->stream));
#endif
        } else if (s->mode == 'r') {
            err = inflateEnd(&(s->stream));
        }
    }
    if (s->file != NULL && fclose(s->file)) {
#ifdef ESPIPE
        if (errno != ESPIPE) /* fclose is broken for pipes in HP/UX */
#endif
            err = Z_ERRNO;
    }
    if (s->z_err < 0) err = s->z_err;

    TRYFREE(s->inbuf);
    TRYFREE(s->outbuf);
    TRYFREE(s->path);
    TRYFREE(s);
    return err;
}